

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

bool __thiscall
asmjit::v1_14::BitVectorRangeIterator<unsigned_long,_0U>::nextRange
          (BitVectorRangeIterator<unsigned_long,_0U> *this,size_t *rangeStart,size_t *rangeEnd,
          size_t rangeHint)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  ulong *puVar6;
  size_t sVar7;
  unsigned_long uVar8;
  
  uVar5 = this->_bitWord;
  puVar6 = this->_ptr;
  sVar7 = this->_idx;
  while (puVar6 = puVar6 + 1, uVar5 == 0) {
    sVar7 = sVar7 + 0x40;
    this->_idx = sVar7;
    if (this->_end <= sVar7) goto LAB_0011bd36;
    this->_ptr = puVar6;
    uVar5 = ~*puVar6;
    this->_bitWord = uVar5;
  }
  lVar1 = 0;
  if (uVar5 != 0) {
    for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  *rangeStart = sVar7 + lVar1;
  uVar3 = this->_bitWord;
  uVar4 = -1L << ((byte)lVar1 & 0x3f);
  uVar2 = uVar3 ^ uVar4;
  this->_bitWord = uVar2;
  if (uVar4 == uVar3) {
    uVar3 = this->_idx + 0x40;
    if (this->_end < uVar3) {
      uVar3 = this->_end;
    }
    *rangeEnd = uVar3;
    while (uVar3 - *rangeStart < rangeHint) {
      sVar7 = this->_idx;
      uVar2 = this->_end;
      uVar3 = sVar7 + 0x40;
      this->_idx = uVar3;
      if (uVar2 <= uVar3) break;
      this->_ptr = puVar6;
      uVar4 = *puVar6;
      this->_bitWord = ~uVar4;
      if (uVar4 != 0) {
        lVar1 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        uVar4 = uVar3 + lVar1;
        if (uVar2 < uVar3 + lVar1) {
          uVar4 = uVar2;
        }
        *rangeEnd = uVar4;
        uVar8 = ~(-1L << ((byte)lVar1 & 0x3f) ^ this->_bitWord);
        goto LAB_0011bd32;
      }
      uVar3 = sVar7 + 0x80;
      if (uVar2 < uVar3) {
        uVar3 = uVar2;
      }
      *rangeEnd = uVar3;
      this->_bitWord = 0;
      puVar6 = puVar6 + 1;
      uVar3 = *rangeEnd;
    }
  }
  else {
    lVar1 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar3 = this->_idx + lVar1;
    if (this->_end < uVar3) {
      uVar3 = this->_end;
    }
    *rangeEnd = uVar3;
    uVar8 = -1L << ((byte)lVar1 & 0x3f) ^ this->_bitWord;
LAB_0011bd32:
    this->_bitWord = uVar8;
  }
LAB_0011bd36:
  return uVar5 != 0;
}

Assistant:

ASMJIT_FORCE_INLINE bool nextRange(size_t* rangeStart, size_t* rangeEnd, size_t rangeHint = std::numeric_limits<size_t>::max()) noexcept {
    // Skip all empty BitWords.
    while (_bitWord == 0) {
      _idx += kBitWordSize;
      if (_idx >= _end)
        return false;
      _bitWord = (*++_ptr) ^ kXorMask;
    }

    size_t i = Support::ctz(_bitWord);

    *rangeStart = _idx + i;
    _bitWord = ~(_bitWord ^ ~(Support::allOnes<T>() << i));

    if (_bitWord == 0) {
      *rangeEnd = Support::min(_idx + kBitWordSize, _end);
      while (*rangeEnd - *rangeStart < rangeHint) {
        _idx += kBitWordSize;
        if (_idx >= _end)
          break;

        _bitWord = (*++_ptr) ^ kXorMask;
        if (_bitWord != Support::allOnes<T>()) {
          size_t j = Support::ctz(~_bitWord);
          *rangeEnd = Support::min(_idx + j, _end);
          _bitWord = _bitWord ^ ~(Support::allOnes<T>() << j);
          break;
        }

        *rangeEnd = Support::min(_idx + kBitWordSize, _end);
        _bitWord = 0;
        continue;
      }

      return true;
    }
    else {
      size_t j = Support::ctz(_bitWord);
      *rangeEnd = Support::min(_idx + j, _end);

      _bitWord = ~(_bitWord ^ ~(Support::allOnes<T>() << j));
      return true;
    }
  }